

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O2

void __thiscall leveldb::BlockBuilder::BlockBuilder(BlockBuilder *this,Options *options)

{
  uint in_EAX;
  undefined8 uStack_28;
  
  this->options_ = options;
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  (this->buffer_)._M_string_length = 0;
  (this->buffer_).field_2._M_local_buf[0] = '\0';
  (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->last_key_)._M_dataplus._M_p = (pointer)&(this->last_key_).field_2;
  (this->last_key_)._M_string_length = 0;
  (this->last_key_).field_2._M_local_buf[0] = '\0';
  if (0 < options->block_restart_interval) {
    uStack_28 = (ulong)in_EAX;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->restarts_,(uint *)((long)&uStack_28 + 4));
    return;
  }
  __assert_fail("options->block_restart_interval >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block_builder.cc"
                ,0x2b,"leveldb::BlockBuilder::BlockBuilder(const Options *)");
}

Assistant:

BlockBuilder::BlockBuilder(const Options* options)
    : options_(options), restarts_(), counter_(0), finished_(false) {
  assert(options->block_restart_interval >= 1);
  restarts_.push_back(0);  // First restart point is at offset 0
}